

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O1

void metacall_detour_destructor(void)

{
  int iVar1;
  
  iVar1 = metacall_link_destroy();
  if (iVar1 != 0) {
    log_write_impl_va("metacall",0xcc,"metacall_detour_destructor",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall.c"
                      ,LOG_LEVEL_ERROR,"Invalid MetaCall link destruction");
  }
  if (((byte)metacall_config_flags & 1) != 0) {
    iVar1 = metacall_fork_destroy();
    if (iVar1 != 0) {
      log_write_impl_va("metacall",0xd5,"metacall_detour_destructor",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall.c"
                        ,LOG_LEVEL_ERROR,"Invalid MetaCall fork destruction");
    }
  }
  detour_destroy();
  return;
}

Assistant:

void metacall_detour_destructor(void)
{
	/* Destroy link */
	if (metacall_link_destroy() != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid MetaCall link destruction");
	}

	/* Destroy fork */
#ifdef METACALL_FORK_SAFE
	if (metacall_config_flags & METACALL_FLAGS_FORK_SAFE)
	{
		if (metacall_fork_destroy() != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid MetaCall fork destruction");
		}
	}
#endif /* METACALL_FORK_SAFE */

	/* Destroy detour */
	detour_destroy();
}